

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O3

void __thiscall vm::VM::ensureStackUsed(VM *this,addr_t count)

{
  InvalidMemoryAccess *this_00;
  string local_40;
  
  if (count + this->_bp <= this->_sp) {
    return;
  }
  this_00 = (InvalidMemoryAccess *)__cxa_allocate_exception(0x28);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"tried to modify important stack info","");
  InvalidMemoryAccess::InvalidMemoryAccess(this_00,&local_40);
  __cxa_throw(this_00,&InvalidMemoryAccess::typeinfo,InvalidMemoryAccess::~InvalidMemoryAccess);
}

Assistant:

void VM::ensureStackUsed(addr_t count) {
    if (_bp + count > _sp) {
        throw InvalidMemoryAccess("tried to modify important stack info");
    }
}